

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  allocator<char> local_6a9;
  string local_6a8;
  char *local_688;
  char *optOutExt;
  string local_678;
  undefined1 local_658 [8];
  string sysName;
  string local_630;
  string local_610 [8];
  string exeSuffix;
  undefined1 local_5d0 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_451;
  string local_450;
  char *local_430;
  char *cpackDownloadAll;
  string local_420;
  char *local_400;
  char *ifwDownloadAll;
  string *r;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_3d0;
  undefined1 local_3b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string local_390;
  char *local_370;
  char *RepoAllStr;
  allocator<char> local_359;
  string local_358;
  char *local_338;
  char *site;
  string local_328;
  allocator<char> local_301;
  string local_300;
  char *local_2e0;
  char *dirs_1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  char *local_288;
  char *dirs;
  string local_278;
  char *local_258;
  char *FrameworkVersionSrt;
  char *RepoGenStr;
  string local_240 [32];
  undefined1 local_220 [8];
  ostringstream cmCPackLog_msg;
  char *BinCreatorStr;
  undefined1 local_98 [8];
  string FrameworkVersionOpt;
  undefined1 local_70 [8];
  string RepoGenOpt;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string BinCreatorOpt;
  cmCPackIFWGenerator *this_local;
  
  BinCreatorOpt.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"CPACK_IFW_BINARYCREATOR_EXECUTABLE",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"CPACK_IFW_REPOGEN_EXECUTABLE",
             (allocator<char> *)(FrameworkVersionOpt.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(FrameworkVersionOpt.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"CPACK_IFW_FRAMEWORK_VERSION",
             (allocator<char> *)((long)&BinCreatorStr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&BinCreatorStr + 7));
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_38);
  if (((!bVar2) ||
      (bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_70), !bVar2))
     || (bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_98), !bVar2))
  {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
  if ((pcVar3 == (char *)0x0) || (bVar2 = cmSystemTools::IsNOTFOUND(pcVar3), bVar2)) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->BinCreator,pcVar3);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    FrameworkVersionSrt =
         cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_70);
    if ((FrameworkVersionSrt == (char *)0x0) ||
       (bVar2 = cmSystemTools::IsNOTFOUND(FrameworkVersionSrt), bVar2)) {
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::operator=((string *)&this->RepoGen,FrameworkVersionSrt);
    }
    local_258 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_98);
    if (local_258 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->FrameworkVersion,"1.9.9");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->FrameworkVersion,local_258);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES",
               (allocator<char> *)((long)&dirs + 7));
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_278);
    this->ResolveDuplicateNames = bVar2;
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirs + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->PkgsDirsVector);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"CPACK_IFW_PACKAGES_DIRECTORIES",&local_2a9);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    local_288 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,pcVar3,(allocator<char> *)((long)&dirs_1 + 7));
      cmSystemTools::ExpandListArgument(&local_2d0,&this->PkgsDirsVector,false);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dirs_1 + 7));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->RepoDirsVector);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CPACK_IFW_REPOSITORIES_DIRECTORIES",&local_301);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    local_2e0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,pcVar3,(allocator<char> *)((long)&site + 7));
      cmSystemTools::ExpandListArgument(&local_328,&this->RepoDirsVector,false);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator((allocator<char> *)((long)&site + 7));
    }
    (this->Installer).super_cmCPackIFWCommon.Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    (this->Repository).super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::operator=((string *)&(this->Repository).Name,"Unspecified");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"CPACK_DOWNLOAD_SITE",&local_359);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    local_338 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&(this->Repository).Url,pcVar3);
      RepoAllStr = (char *)&this->Repository;
      std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::push_back
                (&(this->Installer).RemoteRepositories,(value_type *)&RepoAllStr);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"CPACK_IFW_REPOSITORIES_ALL",
               (allocator<char> *)
               ((long)&RepoAllVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&RepoAllVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_370 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3b0);
      pcVar3 = local_370;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,pcVar3,(allocator<char> *)((long)&__range2 + 7));
      cmSystemTools::ExpandListArgument
                (&local_3d0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b0,false);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3b0);
      r = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b0);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&r), bVar2) {
        ifwDownloadAll =
             (char *)__gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end2);
        GetRepository(this,(string *)ifwDownloadAll);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"CPACK_IFW_DOWNLOAD_ALL",
               (allocator<char> *)((long)&cpackDownloadAll + 7));
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cpackDownloadAll + 7));
    local_400 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"CPACK_DOWNLOAD_ALL",&local_451);
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      local_430 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        this->OnlineOnly = false;
      }
      else {
        bVar2 = cmSystemTools::IsOn(pcVar3);
        this->OnlineOnly = bVar2;
      }
    }
    else {
      bVar2 = cmSystemTools::IsOn(pcVar3);
      this->OnlineOnly = bVar2;
    }
    bVar2 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::empty
                      (&(this->Installer).RemoteRepositories);
    if ((bVar2) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_630,"CMAKE_EXECUTABLE_SUFFIX",
                 (allocator<char> *)(sysName.field_2._M_local_buf + 0xf));
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_630);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_610,pcVar3,(allocator<char> *)(sysName.field_2._M_local_buf + 0xe));
      std::allocator<char>::~allocator((allocator<char> *)(sysName.field_2._M_local_buf + 0xe));
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator((allocator<char> *)(sysName.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"CMAKE_SYSTEM_NAME",(allocator<char> *)((long)&optOutExt + 7))
      ;
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_678);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_658,pcVar3,(allocator<char> *)((long)&optOutExt + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&optOutExt + 6));
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator((allocator<char> *)((long)&optOutExt + 7));
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_658,"Linux");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,".run");
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_658,"Windows");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,".exe");
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_658,"Darwin");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,".app");
          }
          else {
            std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,local_610);
          }
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"CPACK_IFW_PACKAGE_FILE_EXTENSION",&local_6a9);
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
      local_688 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_658,"Darwin");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&this->OutputExtension,".dmg");
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)&this->OutputExtension,(string *)&this->ExecutableSuffix);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&this->OutputExtension,pcVar3);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        pcVar3 = cmCPackGenerator::GetOutputExtension(&this->super_cmCPackGenerator);
        std::__cxx11::string::operator=((string *)&this->OutputExtension,pcVar3);
      }
      this_local._4_4_ = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      RepoGenStr._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_658);
      std::__cxx11::string::~string(local_610);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d0);
      poVar5 = std::operator<<((ostream *)local_5d0,
                               "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x153,pcVar3);
        std::__cxx11::string::~string((string *)(exeSuffix.field_2._M_local_buf + 8));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d0);
      this_local._4_4_ = 0;
      RepoGenStr._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    poVar5 = std::operator<<((ostream *)local_220,
                             "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x10a,pcVar3);
      std::__cxx11::string::~string(local_240);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
    this_local._4_4_ = 0;
    RepoGenStr._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";
  const std::string FrameworkVersionOpt = "CPACK_IFW_FRAMEWORK_VERSION";

  if (!this->IsSet(BinCreatorOpt) || !this->IsSet(RepoGenOpt) ||
      !this->IsSet(FrameworkVersionOpt)) {
    this->ReadListFile("CPackIFW.cmake");
  }

  // Look 'binarycreator' executable (needs)

  const char* BinCreatorStr = this->GetOption(BinCreatorOpt);
  if (!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr)) {
    this->BinCreator.clear();
  } else {
    this->BinCreator = BinCreatorStr;
  }

  if (this->BinCreator.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW compiler \"binarycreator\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Look 'repogen' executable (optional)

  const char* RepoGenStr = this->GetOption(RepoGenOpt);
  if (!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr)) {
    this->RepoGen.clear();
  } else {
    this->RepoGen = RepoGenStr;
  }

  // Framework version
  if (const char* FrameworkVersionSrt = this->GetOption(FrameworkVersionOpt)) {
    this->FrameworkVersion = FrameworkVersionSrt;
  } else {
    this->FrameworkVersion = "1.9.9";
  }

  // Variables that Change Behavior

  // Resolve duplicate names
  this->ResolveDuplicateNames =
    this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  this->PkgsDirsVector.clear();
  if (const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->PkgsDirsVector);
  }

  // Additional repositories dirs
  this->RepoDirsVector.clear();
  if (const char* dirs =
        this->GetOption("CPACK_IFW_REPOSITORIES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->RepoDirsVector);
  }

  // Installer
  this->Installer.Generator = this;
  this->Installer.ConfigureFromOptions();

  // Repository
  this->Repository.Generator = this;
  this->Repository.Name = "Unspecified";
  if (const char* site = this->GetOption("CPACK_DOWNLOAD_SITE")) {
    this->Repository.Url = site;
    this->Installer.RemoteRepositories.push_back(&this->Repository);
  }

  // Repositories
  if (const char* RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL")) {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr, RepoAllVector);
    for (std::string const& r : RepoAllVector) {
      this->GetRepository(r);
    }
  }

  if (const char* ifwDownloadAll = this->GetOption("CPACK_IFW_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
  } else if (const char* cpackDownloadAll =
               this->GetOption("CPACK_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
  } else {
    this->OnlineOnly = false;
  }

  if (!this->Installer.RemoteRepositories.empty() && this->RepoGen.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW repository generator \"repogen\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Executable suffix
  std::string exeSuffix(this->GetOption("CMAKE_EXECUTABLE_SUFFIX"));
  std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
  if (sysName == "Linux") {
    this->ExecutableSuffix = ".run";
  } else if (sysName == "Windows") {
    this->ExecutableSuffix = ".exe";
  } else if (sysName == "Darwin") {
    this->ExecutableSuffix = ".app";
  } else {
    this->ExecutableSuffix = exeSuffix;
  }

  // Output extension
  if (const char* optOutExt =
        this->GetOption("CPACK_IFW_PACKAGE_FILE_EXTENSION")) {
    this->OutputExtension = optOutExt;
  } else if (sysName == "Darwin") {
    this->OutputExtension = ".dmg";
  } else {
    this->OutputExtension = this->ExecutableSuffix;
  }
  if (this->OutputExtension.empty()) {
    this->OutputExtension = this->cmCPackGenerator::GetOutputExtension();
  }

  return this->Superclass::InitializeInternal();
}